

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O0

bool trun::caseMatch(string *caseName,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *caseList)

{
  char cVar1;
  bool bVar2;
  reference __str;
  reference pvVar3;
  undefined1 local_88 [6];
  bool isMatch_1;
  bool isMatch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> negTC;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int executeFlag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *caseList_local;
  string *caseName_local;
  
  cVar1 = '\0';
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(caseList);
  tc.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(caseList);
  while (bVar2 = __gnu_cxx::
                 operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&tc.field_2 + 8)), ((bVar2 ^ 0xffU) & 1) != 0) {
    __str = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_58,__str);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"-");
    if (bVar2) {
      cVar1 = '\x01';
      negTC.field_2._8_4_ = 3;
    }
    else {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,0);
      if (*pvVar3 == '!') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,1,
                   0xffffffffffffffff);
        bVar2 = match(caseName,(string *)local_88);
        if (bVar2) {
          cVar1 = '\0';
          negTC.field_2._8_4_ = 4;
        }
        else {
          negTC.field_2._8_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_88);
        if (negTC.field_2._8_4_ == 0) {
LAB_00153c0e:
          negTC.field_2._8_4_ = 0;
        }
      }
      else {
        bVar2 = match(caseName,(string *)local_58);
        if (!bVar2) goto LAB_00153c0e;
        cVar1 = '\x01';
        negTC.field_2._8_4_ = 4;
      }
    }
    std::__cxx11::string::~string((string *)local_58);
    if ((negTC.field_2._8_4_ != 0) && (negTC.field_2._8_4_ != 3)) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return (bool)(-cVar1 & 1);
}

Assistant:

bool caseMatch(const std::string &caseName, const std::vector<std::string> &caseList) {
        int executeFlag = 0;
        for (auto tc: caseList) {
            if (tc == "-") {
                executeFlag = 1;
                continue;
            }
            if (tc[0]=='!') {
                auto negTC = tc.substr(1);
                auto isMatch = trun::match(caseName, negTC);
                if (isMatch) {
                    executeFlag = 0;
                    goto leave;
                }
            } else {
                auto isMatch = trun::match(caseName, tc);
                if (isMatch) {
                    executeFlag = 1;
                    goto leave;
                }
            }
        }
        leave:
            return executeFlag?true:false;
    }